

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRZ.cpp
# Opt level: O1

void __thiscall OpenMD::GofRZ::writeRdf(GofRZ *this)

{
  pointer pvVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,
             (this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_._M_dataplus._M_p,
             _S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    snprintf(painCave.errMsg,2000,"GofRZ: unable to open %s\n",
             (this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#radial distribution function\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection1: (",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_RadialDistrFunc).selectionScript1_._M_dataplus._M_p,
                        (this->super_RadialDistrFunc).selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\t",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"selection2: (",0xd);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_RadialDistrFunc).selectionScript2_._M_dataplus._M_p,
                        (this->super_RadialDistrFunc).selectionScript2_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#nBins = ",9);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t maxLen = ",0xb);
    poVar4 = std::ostream::_M_insert<double>(this->len_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"deltaR = ",9);
    poVar4 = std::ostream::_M_insert<double>(this->deltaR_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#n",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Bins =",6);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->nZBins_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t delta",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::ostream::_M_insert<double>(this->deltaZ_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((this->avgGofr_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->avgGofr_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar8 = 0;
      do {
        pvVar1 = (this->avgGofr_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + 8) != pdVar5) {
          uVar6 = 0;
          uVar7 = 1;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               (pdVar5[uVar6] / (double)(this->super_RadialDistrFunc).nProcessed_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            pvVar1 = (this->avgGofr_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar5 = pvVar1[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar2 = uVar7 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar1[uVar8].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    (long)pdVar5 >> 3);
            uVar6 = uVar7;
            uVar7 = (ulong)((int)uVar7 + 1);
          } while (bVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar6 = ((long)(this->avgGofr_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->avgGofr_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GofRZ::writeRdf() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial distribution function\n";
      rdfStream << "#selection1: (" << selectionScript1_ << ")\t";
      rdfStream << "selection2: (" << selectionScript2_ << ")\n";
      rdfStream << "#nBins = " << nBins_ << "\t maxLen = " << len_
                << "deltaR = " << deltaR_ << "\n";
      rdfStream << "#n" << axisLabel_ << "Bins =" << nZBins_ << "\t delta"
                << axisLabel_ << " = " << deltaZ_ << "\n";
      for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
        // RealType r = deltaR_ * (i + 0.5);

        for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
          // RealType z = deltaZ_ * (j + 0.5);
          rdfStream << avgGofr_[i][j] / nProcessed_ << "\t";
        }

        rdfStream << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }